

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O0

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::RemoveDotSegments(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                    *this)

{
  SizeType SVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  size_t local_38;
  size_t lastslashpos;
  size_t slashpos;
  size_t newpos;
  size_t pathpos;
  size_t pathlen;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  SVar1 = GetPathStringLength(this);
  uVar2 = (ulong)SVar1;
  newpos = 0;
  slashpos = 0;
  do {
    if (uVar2 <= newpos) {
      this->path_[slashpos] = '\0';
      return;
    }
    for (lastslashpos = 0;
        (newpos + lastslashpos < uVar2 && (this->path_[newpos + lastslashpos] != '/'));
        lastslashpos = lastslashpos + 1) {
    }
    if (((lastslashpos == 2) && (this->path_[newpos] == '.')) && (this->path_[newpos + 1] == '.')) {
      bVar4 = true;
      if (slashpos != 0) {
        bVar4 = this->path_[slashpos - 1] == '/';
      }
      if (!bVar4) {
        __assert_fail("newpos == 0 || path_[newpos - 1] == \'/\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                      ,0x1ac,
                      "void rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::RemoveDotSegments() [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      if (1 < slashpos) {
        do {
          local_38 = slashpos - 1;
          if (local_38 == 0) break;
          lVar3 = slashpos - 2;
          slashpos = local_38;
        } while (this->path_[lVar3] != '/');
        slashpos = local_38;
      }
    }
    else if ((lastslashpos != 1) || (this->path_[newpos] != '.')) {
      if (newpos < slashpos) {
        __assert_fail("newpos <= pathpos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                      ,0x1bd,
                      "void rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::RemoveDotSegments() [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      memmove(this->path_ + slashpos,this->path_ + newpos,lastslashpos);
      slashpos = lastslashpos + slashpos;
      if (newpos + lastslashpos < uVar2) {
        this->path_[slashpos] = '/';
        slashpos = slashpos + 1;
      }
    }
    newpos = lastslashpos + 1 + newpos;
  } while( true );
}

Assistant:

void RemoveDotSegments() {
        std::size_t pathlen = GetPathStringLength();
        std::size_t pathpos = 0;  // Position in path_
        std::size_t newpos = 0;   // Position in new path_

        // Loop through each segment in original path_
        while (pathpos < pathlen) {
            // Get next segment, bounded by '/' or end
            size_t slashpos = 0;
            while ((pathpos + slashpos) < pathlen) {
                if (path_[pathpos + slashpos] == '/') break;
                slashpos++;
            }
            // Check for .. and . segments
            if (slashpos == 2 && path_[pathpos] == '.' && path_[pathpos + 1] == '.') {
                // Backup a .. segment in the new path_
                // We expect to find a previously added slash at the end or nothing
                RAPIDJSON_ASSERT(newpos == 0 || path_[newpos - 1] == '/');
                size_t lastslashpos = newpos;
                // Make sure we don't go beyond the start segment
                if (lastslashpos > 1) {
                    // Find the next to last slash and back up to it
                    lastslashpos--;
                    while (lastslashpos > 0) {
                        if (path_[lastslashpos - 1] == '/') break;
                        lastslashpos--;
                    }
                    // Set the new path_ position
                    newpos = lastslashpos;
                }
            } else if (slashpos == 1 && path_[pathpos] == '.') {
                // Discard . segment, leaves new path_ unchanged
            } else {
                // Move any other kind of segment to the new path_
                RAPIDJSON_ASSERT(newpos <= pathpos);
                std::memmove(&path_[newpos], &path_[pathpos], slashpos * sizeof(Ch));
                newpos += slashpos;
                // Add slash if not at end
                if ((pathpos + slashpos) < pathlen) {
                    path_[newpos] = '/';
                    newpos++;
                }
            }
            // Move to next segment
            pathpos += slashpos + 1;
        }
        path_[newpos] = '\0';
    }